

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RefCntAutoPtr.hpp
# Opt level: O0

RefCntAutoPtr<Diligent::ISwapChainGL> * __thiscall
Diligent::RefCntAutoPtr<Diligent::ISwapChainGL>::operator=
          (RefCntAutoPtr<Diligent::ISwapChainGL> *this,ISwapChainGL *pObj)

{
  ISwapChainGL *pObj_local;
  RefCntAutoPtr<Diligent::ISwapChainGL> *this_local;
  
  if (this->m_pObject != pObj) {
    if (this->m_pObject != (ISwapChainGL *)0x0) {
      (**(code **)(*(long *)this->m_pObject + 0x10))();
    }
    this->m_pObject = pObj;
    if (this->m_pObject != (ISwapChainGL *)0x0) {
      (**(code **)(*(long *)this->m_pObject + 8))();
    }
  }
  return this;
}

Assistant:

RefCntAutoPtr& operator=(T* pObj) noexcept
    {
        if (m_pObject != pObj)
        {
            if (m_pObject)
                m_pObject->Release();
            m_pObject = pObj;
            if (m_pObject)
                m_pObject->AddRef();
        }
        return *this;
    }